

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::isStageSupported
          (SSBLayoutQualifierConflictTest *this,STAGES stage)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 local_28;
  int local_24;
  GLenum pname;
  GLint max_supported_buffers;
  Functions *gl;
  SSBLayoutQualifierConflictTest *pSStack_10;
  STAGES stage_local;
  SSBLayoutQualifierConflictTest *this_local;
  
  gl._4_4_ = stage;
  pSStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_NegativeTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _pname = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  switch(gl._4_4_) {
  case COMPUTE:
    local_28 = 0x90db;
    break;
  case VERTEX:
    local_28 = 0x90d6;
    break;
  case TESS_CTRL:
    local_28 = 0x90d8;
    break;
  case TESS_EVAL:
    local_28 = 0x90d9;
    break;
  case GEOMETRY:
    local_28 = 0x90d7;
    break;
  case FRAGMENT:
    local_28 = 0x90da;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x2a8e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_pname + 0x868))(local_28,&local_24);
  err = (**(code **)(_pname + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2a92);
  return 0 < local_24;
}

Assistant:

bool SSBLayoutQualifierConflictTest::isStageSupported(Utils::Shader::STAGES stage)
{
	const Functions& gl					   = m_context.getRenderContext().getFunctions();
	GLint			 max_supported_buffers = 0;
	GLenum			 pname				   = 0;

	switch (stage)
	{
	case Utils::Shader::COMPUTE:
		pname = GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::FRAGMENT:
		pname = GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::GEOMETRY:
		pname = GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::TESS_CTRL:
		pname = GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::TESS_EVAL:
		pname = GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::VERTEX:
		pname = GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	gl.getIntegerv(pname, &max_supported_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return 1 <= max_supported_buffers;
}